

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O1

void __thiscall r_exec::Group::Group(Group *this,SysObject *source)

{
  _Rb_tree_header *p_Var1;
  
  LObject::LObject(&this->super_LObject,source);
  (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
  super__Object._vptr__Object = (_func_int **)&PTR__Group_001bfbd8;
  this->sln_change_monitoring_periods_to_go = 0;
  this->act_change_monitoring_periods_to_go = 0;
  (this->mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->ipgm_views)._M_h._M_buckets = &(this->ipgm_views)._M_h._M_single_bucket;
  (this->ipgm_views)._M_h._M_bucket_count = 1;
  (this->ipgm_views)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->ipgm_views)._M_h._M_element_count = 0;
  (this->ipgm_views)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->ipgm_views)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->ipgm_views)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->anti_ipgm_views)._M_h._M_buckets = &(this->anti_ipgm_views)._M_h._M_single_bucket;
  (this->anti_ipgm_views)._M_h._M_bucket_count = 1;
  (this->anti_ipgm_views)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->anti_ipgm_views)._M_h._M_element_count = 0;
  (this->anti_ipgm_views)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->anti_ipgm_views)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->anti_ipgm_views)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->input_less_ipgm_views)._M_h._M_buckets =
       &(this->input_less_ipgm_views)._M_h._M_single_bucket;
  (this->input_less_ipgm_views)._M_h._M_bucket_count = 1;
  (this->input_less_ipgm_views)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->input_less_ipgm_views)._M_h._M_element_count = 0;
  (this->input_less_ipgm_views)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->input_less_ipgm_views)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->input_less_ipgm_views)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->notification_views)._M_h._M_buckets = &(this->notification_views)._M_h._M_single_bucket;
  (this->notification_views)._M_h._M_bucket_count = 1;
  (this->notification_views)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->notification_views)._M_h._M_element_count = 0;
  (this->notification_views)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->notification_views)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->notification_views)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->group_views)._M_h._M_buckets = &(this->group_views)._M_h._M_single_bucket;
  (this->group_views)._M_h._M_bucket_count = 1;
  (this->group_views)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->group_views)._M_h._M_element_count = 0;
  (this->group_views)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->group_views)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->group_views)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->other_views)._M_h._M_buckets = &(this->other_views)._M_h._M_single_bucket;
  (this->other_views)._M_h._M_bucket_count = 1;
  (this->other_views)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->other_views)._M_h._M_element_count = 0;
  (this->other_views)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->other_views)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->other_views)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->viewing_groups)._M_h._M_buckets = &(this->viewing_groups)._M_h._M_single_bucket;
  (this->viewing_groups)._M_h._M_bucket_count = 1;
  (this->viewing_groups)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->viewing_groups)._M_h._M_element_count = 0;
  (this->viewing_groups)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->viewing_groups)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->viewing_groups)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->newly_salient_views)._M_t._M_impl.super__Rb_tree_header;
  (this->newly_salient_views)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->newly_salient_views)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->newly_salient_views)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->newly_salient_views)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  this->c_act_thr_changes = 0;
  this->acc_c_act_thr = 0.0;
  this->c_sln_thr_changes = 0;
  this->acc_c_sln_thr = 0.0;
  this->c_act_changes = 0;
  this->acc_c_act = 0.0;
  this->c_sln_changes = 0;
  this->acc_c_sln = 0.0;
  this->vis_thr_changes = 0;
  this->acc_vis_thr = 0.0;
  this->act_thr_changes = 0;
  this->acc_act_thr = 0.0;
  this->sln_thr_changes = 0;
  this->acc_sln_thr = 0.0;
  (this->pending_operations).
  super__Vector_base<r_exec::Group::Operation_*,_std::allocator<r_exec::Group::Operation_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pending_operations).
  super__Vector_base<r_exec::Group::Operation_*,_std::allocator<r_exec::Group::Operation_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pending_operations).
  super__Vector_base<r_exec::Group::Operation_*,_std::allocator<r_exec::Group::Operation_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->new_controllers).
  super__Vector_base<r_exec::Controller_*,_std::allocator<r_exec::Controller_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->new_controllers).
  super__Vector_base<r_exec::Controller_*,_std::allocator<r_exec::Controller_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->newly_salient_views)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->new_controllers).
  super__Vector_base<r_exec::Controller_*,_std::allocator<r_exec::Controller_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  reset_stats(this);
  this->sln_decay = 0.0;
  this->sln_thr_decay = 0.0;
  this->decay_periods_to_go = -1;
  this->decay_percentage_per_period = 0.0;
  this->decay_target = -1.0;
  return;
}

Assistant:

Group::Group(r_code::SysObject *source): LObject(source)
{
    reset_ctrl_values();
    reset_stats();
    reset_decay_values();
}